

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# offset64_test.cpp
# Opt level: O0

void flatbuffers::tests::Offset64CreateDirect(void)

{
  initializer_list<unsigned_char> __l;
  bool expval;
  Offset<RootTable> root;
  uint expval_00;
  size_t buffer_minalign;
  uint8_t *puVar1;
  SizeT buf_len;
  RootTable *this;
  Vector<unsigned_char,_unsigned_int> *this_00;
  size_type_conflict sVar2;
  Vector64<uint8_t> *this_01;
  unsigned_long expval_01;
  String *pSVar3;
  char *pcVar4;
  RootTable *root_table;
  Verifier verifier;
  Options options;
  Offset<RootTable> root_table_offset;
  allocator<unsigned_char> local_b4;
  uchar local_b3 [3];
  iterator local_b0;
  size_type_conflict local_a8;
  undefined1 local_a0 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  FlatBufferBuilder64 fbb;
  
  buffer_minalign = AlignOf<unsigned_long>();
  FlatBufferBuilderImpl<true>::FlatBufferBuilderImpl
            ((FlatBufferBuilderImpl<true> *)
             &data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,0x400,(Allocator *)0x0,false,buffer_minalign
            );
  local_b3[0] = '\0';
  local_b3[1] = 1;
  local_b3[2] = 2;
  local_b0 = local_b3;
  local_a8 = 3;
  std::allocator<unsigned_char>::allocator(&local_b4);
  __l._M_len = local_a8;
  __l._M_array = local_b0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_a0,__l,&local_b4);
  std::allocator<unsigned_char>::~allocator(&local_b4);
  root = CreateRootTableDirect
                   ((FlatBufferBuilder64 *)
                    &data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage,
                    (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_a0,0,
                    "some far string",
                    (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_a0,
                    "some near string",(vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0,
                    (vector<LeafStruct,_std::allocator<LeafStruct>_> *)0x0,
                    (vector<LeafStruct,_std::allocator<LeafStruct>_> *)0x0,
                    (vector<flatbuffers::Offset<WrapperTable>,_std::allocator<flatbuffers::Offset<WrapperTable>_>_>
                     *)0x0,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0);
  FlatBufferBuilderImpl<true>::Finish<RootTable>
            ((FlatBufferBuilderImpl<true> *)
             &data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,root,(char *)0x0);
  VerifierTemplate<false>::Options::Options((Options *)&verifier.flex_reuse_tracker_);
  std::numeric_limits<long>::max();
  puVar1 = FlatBufferBuilderImpl<true>::GetBufferPointer
                     ((FlatBufferBuilderImpl<true> *)
                      &data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage);
  buf_len = FlatBufferBuilderImpl<true>::GetSize
                      ((FlatBufferBuilderImpl<true> *)
                       &data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage);
  VerifierTemplate<false>::VerifierTemplate
            ((VerifierTemplate<false> *)&root_table,puVar1,buf_len,
             (Options *)&verifier.flex_reuse_tracker_);
  expval = VerifyRootTableBuffer((Verifier *)&root_table);
  TestEq<bool,bool>(expval,true,"\'VerifyRootTableBuffer(verifier)\' != \'true\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/64bit/offset64_test.cpp"
                    ,199,"");
  puVar1 = FlatBufferBuilderImpl<true>::GetBufferPointer
                     ((FlatBufferBuilderImpl<true> *)
                      &data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage);
  this = GetRootTable(puVar1);
  this_00 = RootTable::far_vector(this);
  expval_00 = Vector<unsigned_char,_unsigned_int>::size(this_00);
  sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_a0);
  TestEq<unsigned_int,unsigned_long>
            (expval_00,sVar2,"\'root_table->far_vector()->size()\' != \'data.size()\'",
             "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/64bit/offset64_test.cpp"
             ,0xcb,"");
  this_01 = RootTable::big_vector(this);
  expval_01 = Vector<unsigned_char,_unsigned_long>::size(this_01);
  sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_a0);
  TestEq<unsigned_long,unsigned_long>
            (expval_01,sVar2,"\'root_table->big_vector()->size()\' != \'data.size()\'",
             "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/64bit/offset64_test.cpp"
             ,0xcc,"");
  pSVar3 = RootTable::far_string(this);
  pcVar4 = String::c_str(pSVar3);
  TestEqStr(pcVar4,"some far string",
            "\'root_table->far_string()->c_str()\' != \'\"some far string\"\'",
            "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/64bit/offset64_test.cpp"
            ,0xcd,"");
  pSVar3 = RootTable::near_string(this);
  pcVar4 = String::c_str(pSVar3);
  TestEqStr(pcVar4,"some near string",
            "\'root_table->near_string()->c_str()\' != \'\"some near string\"\'",
            "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/64bit/offset64_test.cpp"
            ,0xce,"");
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_a0);
  FlatBufferBuilderImpl<true>::~FlatBufferBuilderImpl
            ((FlatBufferBuilderImpl<true> *)
             &data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void Offset64CreateDirect() {
  FlatBufferBuilder64 fbb;

  // Create a vector of some data
  std::vector<uint8_t> data{ 0, 1, 2 };

  // Call the "Direct" creation method to ensure that things are added to the
  // buffer in the correct order, Offset64 first followed by any Offsets.
  const Offset<RootTable> root_table_offset = CreateRootTableDirect(
      fbb, &data, 0, "some far string", &data, "some near string");

  // Finish the buffer.
  fbb.Finish(root_table_offset);

  Verifier::Options options;
  // Allow the verifier to verify 64-bit buffers.
  options.max_size = FLATBUFFERS_MAX_64_BUFFER_SIZE;
  options.assert = true;

  Verifier verifier(fbb.GetBufferPointer(), fbb.GetSize(), options);

  TEST_EQ(VerifyRootTableBuffer(verifier), true);

  // Verify the data.
  const RootTable *root_table = GetRootTable(fbb.GetBufferPointer());
  TEST_EQ(root_table->far_vector()->size(), data.size());
  TEST_EQ(root_table->big_vector()->size(), data.size());
  TEST_EQ_STR(root_table->far_string()->c_str(), "some far string");
  TEST_EQ_STR(root_table->near_string()->c_str(), "some near string");
}